

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_fma.cpp
# Opt level: O0

int ncnn::binary_op_scalar<ncnn::BinaryOp_x86_fma_functor::binary_op_rpow>
              (Mat *a,float b,Mat *c,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  long *in_RSI;
  binary_op_rpow *this;
  long *in_RDI;
  uint in_XMM0_Da;
  float fVar3;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined1 auVar4 [32];
  undefined8 uVar8;
  __m128 afVar9;
  __m128 _p_1;
  __m128 _b;
  __m256 _p;
  __m256 _b_avx;
  int i;
  float *outptr;
  float *ptr;
  int q;
  int size;
  int channels;
  binary_op_rpow op;
  Mat *m;
  Mat *m_1;
  __m256 *in_stack_fffffffffffffc00;
  undefined4 in_stack_fffffffffffffc08;
  uint uVar10;
  float local_3a0 [2];
  float afStack_398 [2];
  float local_390 [4];
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 uStack_350;
  undefined8 uStack_348;
  int local_324;
  undefined8 local_320;
  undefined8 local_318;
  undefined8 local_310;
  undefined4 local_308;
  long local_300;
  undefined4 local_2f8;
  undefined4 local_2f4;
  undefined4 local_2f0;
  undefined4 local_2ec;
  undefined4 local_2e8;
  undefined8 local_2e0;
  binary_op_rpow *local_2d8;
  undefined8 local_2d0;
  undefined8 local_2c8;
  undefined8 local_2c0;
  undefined4 local_2b8;
  long local_2b0;
  undefined4 local_2a8;
  undefined4 local_2a4;
  undefined4 local_2a0;
  undefined4 local_29c;
  undefined4 local_298;
  undefined8 local_290;
  float *local_288;
  int local_280;
  int local_27c;
  int local_278;
  binary_op_rpow local_271 [9];
  long *local_268;
  uint local_25c;
  long *local_258;
  undefined1 local_24d;
  int local_24c;
  undefined8 *local_240;
  undefined8 *local_238;
  undefined8 *local_228;
  undefined8 *local_220;
  undefined1 local_215;
  int local_214;
  undefined8 *local_208;
  undefined8 *local_1f8;
  float *local_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  binary_op_rpow *local_1b8;
  uint local_1b0;
  uint uStack_1ac;
  uint uStack_1a8;
  uint uStack_1a4;
  uint local_19c;
  float *local_198;
  float local_190 [2];
  float afStack_188 [4];
  binary_op_rpow *local_178;
  long local_170;
  undefined4 local_164;
  long local_160;
  binary_op_rpow *local_158;
  undefined4 local_14c;
  int local_148;
  int local_144;
  undefined8 *local_140;
  long local_138;
  undefined4 local_12c;
  long local_128;
  float *local_120;
  undefined4 local_114;
  int local_110;
  int local_10c;
  undefined8 *local_108;
  undefined4 local_fc;
  long local_f8;
  undefined4 local_ec;
  long local_e8;
  undefined8 *local_c8;
  undefined8 *local_b8;
  undefined1 local_80 [32];
  
  local_278 = (int)in_RDI[7];
  local_27c = *(int *)((long)in_RDI + 0x2c) * (int)in_RDI[6] * *(int *)((long)in_RDI + 0x34) *
              (int)in_RDI[3];
  local_268 = in_RSI;
  local_25c = in_XMM0_Da;
  local_258 = in_RDI;
  for (local_280 = 0; local_280 < local_278; local_280 = local_280 + 1) {
    local_240 = &local_2d0;
    local_10c = *(int *)((long)local_258 + 0x2c);
    local_110 = (int)local_258[6];
    local_114 = *(undefined4 *)((long)local_258 + 0x34);
    local_288 = (float *)(*local_258 + local_258[8] * (long)local_280 * local_258[2]);
    local_128 = local_258[2];
    local_12c = (undefined4)local_258[3];
    local_138 = local_258[4];
    local_108 = &local_2d0;
    local_f8 = (long)local_10c * (long)local_110 * local_128;
    local_238 = &local_2d0;
    local_228 = &local_2d0;
    local_208 = &local_320;
    local_144 = *(int *)((long)local_268 + 0x2c);
    local_148 = (int)local_268[6];
    local_14c = *(undefined4 *)((long)local_268 + 0x34);
    this = (binary_op_rpow *)(*local_268 + local_268[8] * (long)local_280 * local_268[2]);
    local_160 = local_268[2];
    local_164 = (undefined4)local_268[3];
    local_170 = local_268[4];
    local_140 = &local_320;
    local_e8 = (long)local_144 * (long)local_148 * local_160;
    local_1f8 = &local_320;
    local_220 = &local_320;
    local_298 = 0;
    local_29c = 0;
    local_2a0 = 0;
    local_2a4 = 0;
    local_2b8 = 0;
    local_2c0 = 0;
    local_2c8 = 0;
    local_2d0 = 0;
    local_ec = 0x10;
    local_fc = 0x10;
    local_214 = local_280;
    local_215 = 1;
    local_24c = local_280;
    local_24d = 1;
    local_290 = 0;
    local_2a8 = 0;
    local_320 = 0;
    local_310 = 0;
    local_308 = 0;
    local_2f8 = 0;
    local_2f4 = 0;
    local_2f0 = 0;
    local_2ec = 0;
    local_2e8 = 0;
    local_2e0 = 0;
    local_318 = 0;
    local_324 = 0;
    auVar1 = vinsertps_avx(ZEXT416(local_25c),ZEXT416(local_25c),0x10);
    auVar1 = vinsertps_avx(auVar1,ZEXT416(local_25c),0x20);
    auVar1 = vinsertps_avx(auVar1,ZEXT416(local_25c),0x30);
    auVar2 = vinsertps_avx(ZEXT416(local_25c),ZEXT416(local_25c),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(local_25c),0x20);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(local_25c),0x30);
    auVar4._16_16_ = auVar1;
    auVar4._0_16_ = auVar2;
    local_80._0_8_ = auVar2._0_8_;
    local_80._8_8_ = auVar2._8_8_;
    local_80._16_8_ = auVar1._0_8_;
    local_80._24_8_ = auVar1._8_8_;
    local_360 = local_80._0_8_;
    uStack_358 = local_80._8_8_;
    uStack_350 = local_80._16_8_;
    uStack_348 = local_80._24_8_;
    uVar10 = local_25c;
    local_2d8 = this;
    local_158 = this;
    local_120 = local_288;
    local_c8 = local_220;
    local_b8 = local_228;
    local_80 = auVar4;
    local_300 = local_170;
    local_2b0 = local_138;
    for (; local_324 + 7 < local_27c; local_324 = local_324 + 8) {
      local_1e8 = local_288;
      uVar6 = *(undefined8 *)local_288;
      uVar5 = *(undefined8 *)(local_288 + 2);
      uVar7 = *(undefined8 *)(local_288 + 4);
      uVar8 = *(undefined8 *)(local_288 + 6);
      local_380 = uVar6;
      uStack_378 = uVar5;
      uStack_370 = uVar7;
      uStack_368 = uVar8;
      BinaryOp_x86_fma_functor::binary_op_rpow::func_pack8
                (this,(__m256 *)CONCAT44(uVar10,in_stack_fffffffffffffc08),in_stack_fffffffffffffc00
                );
      local_1b8 = local_2d8;
      *(undefined8 *)local_2d8 = uVar6;
      *(undefined8 *)(local_2d8 + 8) = uVar5;
      *(undefined8 *)(local_2d8 + 0x10) = uVar7;
      *(undefined8 *)(local_2d8 + 0x18) = uVar8;
      local_288 = local_288 + 8;
      local_2d8 = local_2d8 + 0x20;
      local_380 = uVar6;
      uStack_378 = uVar5;
      uStack_370 = uVar7;
      uStack_368 = uVar8;
      local_1e0 = uVar6;
      uStack_1d8 = uVar5;
      uStack_1d0 = uVar7;
      uStack_1c8 = uVar8;
    }
    local_19c = local_25c;
    local_1b0 = local_25c;
    uStack_1ac = local_25c;
    uStack_1a8 = local_25c;
    uStack_1a4 = local_25c;
    for (; local_324 + 3 < local_27c; local_324 = local_324 + 4) {
      local_198 = local_288;
      local_3a0 = *(float (*) [2])local_288;
      uVar6 = *(undefined8 *)(local_288 + 2);
      afStack_398 = (float  [2])uVar6;
      afVar9 = BinaryOp_x86_fma_functor::binary_op_rpow::func_pack4
                         (local_271,(__m128 *)local_3a0,&local_390);
      local_3a0 = afVar9._0_8_;
      local_178 = local_2d8;
      *(float (*) [2])local_2d8 = local_3a0;
      *(undefined8 *)(local_2d8 + 8) = uVar6;
      local_288 = local_288 + 4;
      local_2d8 = local_2d8 + 0x10;
      afStack_398 = (float  [2])uVar6;
      local_190 = local_3a0;
      afStack_188._0_8_ = uVar6;
    }
    for (; local_324 < local_27c; local_324 = local_324 + 1) {
      fVar3 = BinaryOp_x86_fma_functor::binary_op_rpow::func
                        ((binary_op_rpow *)CONCAT44(uVar10,in_stack_fffffffffffffc08),
                         *in_stack_fffffffffffffc00,(float *)0x1116a0a);
      *(float *)local_2d8 = fVar3;
      local_288 = local_288 + 1;
      local_2d8 = local_2d8 + 4;
    }
  }
  return 0;
}

Assistant:

static int binary_op_scalar(const Mat& a, float b, Mat& c, const Option& opt)
{
    Op op;

    const int channels = a.c;
    const int size = a.w * a.h * a.d * a.elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = a.channel(q);
        float* outptr = c.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _b_avx512 = _mm512_set1_ps(b);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = op.func_pack16(_p, _b_avx512);
            _mm512_storeu_ps(outptr, _p);
            ptr += 16;
            outptr += 16;
        }
#endif // __AVX512F__
        __m256 _b_avx = _mm256_set1_ps(b);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = op.func_pack8(_p, _b_avx);
            _mm256_storeu_ps(outptr, _p);
            ptr += 8;
            outptr += 8;
        }
#endif // __AVX__
        __m128 _b = _mm_set1_ps(b);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _p = op.func_pack4(_p, _b);
            _mm_store_ps(outptr, _p);
            ptr += 4;
            outptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *outptr = op.func(*ptr, b);
            ptr++;
            outptr++;
        }
    }

    return 0;
}